

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O1

void __thiscall leveldb::DBImpl::ReleaseSnapshot(DBImpl *this,Snapshot *snapshot)

{
  int iVar1;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->mutex_);
  if (iVar1 == 0) {
    SnapshotList::Delete(&this->snapshots_,(SnapshotImpl *)snapshot);
    pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void DBImpl::ReleaseSnapshot(const Snapshot* snapshot) {
  MutexLock l(&mutex_);
  snapshots_.Delete(static_cast<const SnapshotImpl*>(snapshot));
}